

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

int mpack_tag_cmp(mpack_tag_t left,mpack_tag_t right)

{
  int iVar1;
  mpack_type_t mVar2;
  mpack_type_t mVar3;
  mpack_type_t mVar4;
  mpack_tag_t right_local;
  mpack_tag_t left_local;
  
  mVar3 = left.type;
  mVar4 = mVar3;
  if (-1 < left.v.i) {
    mVar4 = mpack_type_uint;
  }
  if (mVar3 != mpack_type_int) {
    mVar4 = mVar3;
  }
  mVar2 = right.type;
  mVar3 = mpack_type_uint;
  if (right.v.i < 0) {
    mVar3 = mVar2;
  }
  if (mVar2 != mpack_type_int) {
    mVar3 = mVar2;
  }
  if (mVar4 - mVar3 == 0) {
    iVar1 = (*(code *)(&DAT_0010c648 + *(int *)(&DAT_0010c648 + (ulong)(mVar4 - mpack_type_nil) * 4)
                      ))(left.v.u,&DAT_0010c648 +
                                  *(int *)(&DAT_0010c648 + (ulong)(mVar4 - mpack_type_nil) * 4));
    return iVar1;
  }
  return mVar4 - mVar3;
}

Assistant:

int mpack_tag_cmp(mpack_tag_t left, mpack_tag_t right) {

    // positive numbers may be stored as int; convert to uint
    if (left.type == mpack_type_int && left.v.i >= 0) {
        left.type = mpack_type_uint;
        left.v.u = (uint64_t)left.v.i;
    }
    if (right.type == mpack_type_int && right.v.i >= 0) {
        right.type = mpack_type_uint;
        right.v.u = (uint64_t)right.v.i;
    }

    if (left.type != right.type)
        return (int)left.type - (int)right.type;

    switch (left.type) {
        case mpack_type_nil:
            return 0;

        case mpack_type_bool:
            return (int)left.v.b - (int)right.v.b;

        case mpack_type_int:
            if (left.v.i == right.v.i)
                return 0;
            return (left.v.i < right.v.i) ? -1 : 1;

        case mpack_type_uint:
            if (left.v.u == right.v.u)
                return 0;
            return (left.v.u < right.v.u) ? -1 : 1;

        case mpack_type_array:
        case mpack_type_map:
            if (left.v.n == right.v.n)
                return 0;
            return (left.v.n < right.v.n) ? -1 : 1;

        case mpack_type_str:
        case mpack_type_bin:
            if (left.v.l == right.v.l)
                return 0;
            return (left.v.l < right.v.l) ? -1 : 1;

        case mpack_type_ext:
            if (left.v.ext.exttype == right.v.ext.exttype) {
                if (left.v.ext.length == right.v.ext.length)
                    return 0;
                return (left.v.ext.length < right.v.ext.length) ? -1 : 1;
            }
            return (int)left.v.ext.exttype - (int)right.v.ext.exttype;

        // floats should not normally be compared for equality. we compare
        // with memcmp() to silence compiler warnings, but this will return
        // equal if both are NaNs with the same representation (though we may
        // want this, for instance if you are for some bizarre reason using
        // floats as map keys.) i'm not sure what the right thing to
        // do is here. check for NaN first? always return false if the type
        // is float? use operator== and pragmas to silence compiler warning?
        // please send me your suggestions.
        // note also that we don't convert floats to doubles, so when this is
        // used for ordering purposes, all floats are ordered before all
        // doubles.
        case mpack_type_float:
            return mpack_memcmp(&left.v.f, &right.v.f, sizeof(left.v.f));
        case mpack_type_double:
            return mpack_memcmp(&left.v.d, &right.v.d, sizeof(left.v.d));

        default:
            break;
    }
    
    mpack_assert(0, "unrecognized type %i", (int)left.type);
    return false;
}